

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O3

void __thiscall QDesktopUnixServices::setApplicationBadge(QDesktopUnixServices *this,qint64 number)

{
  undefined8 uVar1;
  longlong __old_val;
  QVariant *pQVar2;
  QDesktopUnixServices *this_00;
  P _b;
  anon_union_24_3_e3d07ef4_for_data *paVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  longlong lVar7;
  long lVar8;
  long in_FS_OFFSET;
  QDBusMessage signal;
  QArrayData *d;
  QArrayData *local_110;
  char16_t *local_108;
  undefined8 local_100;
  undefined1 *local_f8;
  QMap<QString,_QVariant> local_f0;
  QArrayData *local_e8;
  PrivateShared *pPStack_e0;
  qsizetype local_d8;
  QStringBuilder<QString,_QString> local_c8;
  QString local_98;
  undefined1 local_80 [24];
  QArrayData *local_68;
  anon_union_24_3_e3d07ef4_for_data aStack_60;
  char16_t *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QGuiApplication::desktopFileName();
  uVar1 = local_80._16_8_;
  if ((QArrayData *)local_80._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_80._0_8_ = *(int *)local_80._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_80._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_80._0_8_,2,0x10);
    }
  }
  if (uVar1 == 0) {
    this_00 = (QDesktopUnixServices *)QtPrivateLogging::lcQpaServices();
    if (((ulong)(this_00->m_webBrowser).d.ptr & 0x100) != 0) {
      setApplicationBadge(this_00);
    }
  }
  else {
    local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QGuiApplication::desktopFileName();
    aStack_60._8_8_ = local_d8;
    aStack_60.shared = pPStack_e0;
    local_68 = local_e8;
    local_d8 = 0;
    local_c8.a.d.d = (Data *)0x0;
    local_80._0_8_ = (PrivateShared *)0x0;
    local_c8.a.d.ptr = (char16_t *)0x0;
    local_c8.a.d.size = 0;
    local_80._8_8_ = L"application://";
    local_80._16_8_ = 0xe;
    local_c8.b.d.d = (Data *)0x0;
    local_c8.b.d.ptr = (char16_t *)0x0;
    local_e8 = (QArrayData *)0x0;
    pPStack_e0 = (PrivateShared *)0x0;
    local_c8.b.d.size = 0;
    aStack_60._16_8_ = (Data *)0x0;
    local_48 = L".desktop";
    local_40 = &DAT_00000008;
    QStringBuilder<QStringBuilder<QString,_QString>,_QString>::convertTo<QString>
              (&local_98,(QStringBuilder<QStringBuilder<QString,_QString>,_QString> *)local_80);
    QStringBuilder<QStringBuilder<QString,_QString>,_QString>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<QString,_QString>,_QString> *)local_80);
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_c8);
    if (local_e8 != (QArrayData *)0x0) {
      LOCK();
      (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_e8,2,0x10);
      }
    }
    local_f0.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
          )(totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
            )0x0;
    if (number < 1) {
      bVar6 = false;
    }
    else {
      lVar7 = 9999;
      if ((ulong)number < 9999) {
        lVar7 = number;
      }
      ::QVariant::QVariant((QVariant *)local_80,lVar7);
      local_c8.a.d.d = (Data *)0x0;
      local_c8.a.d.ptr = L"count";
      local_c8.a.d.size = 5;
      pQVar2 = QMap<QString,_QVariant>::operator[](&local_f0,&local_c8.a);
      ::QVariant::operator=(pQVar2,(QVariant *)local_80);
      if (&(local_c8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c8.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      ::QVariant::~QVariant((QVariant *)local_80);
      bVar6 = true;
    }
    ::QVariant::QVariant((QVariant *)local_80,bVar6);
    local_c8.a.d.d = (Data *)0x0;
    local_c8.a.d.ptr = L"count-visible";
    local_c8.a.d.size = 0xd;
    pQVar2 = QMap<QString,_QVariant>::operator[](&local_f0,&local_c8.a);
    ::QVariant::operator=(pQVar2,(QVariant *)local_80);
    if (&(local_c8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    ::QVariant::~QVariant((QVariant *)local_80);
    local_f8 = &DAT_aaaaaaaaaaaaaaaa;
    QCoreApplication::applicationName();
    aStack_60._8_8_ = local_d8;
    aStack_60.shared = pPStack_e0;
    local_68 = local_e8;
    local_80._0_8_ = (QArrayData *)0x0;
    local_80._8_8_ = L"/com/canonical/unity/launcherentry/";
    local_80._16_8_ = 0x23;
    local_e8 = (QArrayData *)0x0;
    pPStack_e0 = (PrivateShared *)0x0;
    local_d8 = 0;
    QStringBuilder<QString,_QString>::convertTo<QString>
              (&local_c8.a,(QStringBuilder<QString,_QString> *)local_80);
    local_110 = (QArrayData *)0x0;
    local_108 = L"com.canonical.Unity.LauncherEntry";
    local_100 = 0x21;
    QDBusMessage::createSignal((QString *)&local_f8,(QString *)&local_c8,(QString *)&local_110);
    if (local_110 != (QArrayData *)0x0) {
      LOCK();
      (local_110->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_110->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_110->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_110,2,0x10);
      }
    }
    if (&(local_c8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    QStringBuilder<QString,_QString>::~QStringBuilder((QStringBuilder<QString,_QString> *)local_80);
    if (local_e8 != (QArrayData *)0x0) {
      LOCK();
      (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_e8,2,0x10);
      }
    }
    ::QVariant::QVariant((QVariant *)local_80,(QString *)&local_98);
    ::QVariant::QVariant((QVariant *)&aStack_60,(QMap *)&local_f0);
    local_c8.a.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = (QVariant *)QArrayData::allocate((QArrayData **)&local_c8,0x20,0x10,2,KeepSize);
    paVar3 = (anon_union_24_3_e3d07ef4_for_data *)local_80;
    lVar4 = 1;
    bVar6 = true;
    local_c8.a.d.ptr = (char16_t *)pQVar2;
    do {
      bVar5 = bVar6;
      lVar8 = lVar4;
      ::QVariant::QVariant(pQVar2,(QVariant *)paVar3);
      pQVar2 = pQVar2 + 1;
      paVar3 = &aStack_60;
      lVar4 = lVar8 + 1;
      bVar6 = false;
      local_c8.a.d.size = lVar8;
    } while (bVar5);
    QDBusMessage::setArguments((QList_conflict *)&local_f8);
    QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&local_c8);
    lVar4 = 0x20;
    do {
      ::QVariant::~QVariant((QVariant *)(local_80 + lVar4));
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
    QDBusConnection::sessionBus();
    QDBusConnection::send((QDBusMessage *)local_80);
    QDBusConnection::~QDBusConnection((QDBusConnection *)local_80);
    QDBusMessage::~QDBusMessage((QDBusMessage *)&local_f8);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_f0.d);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDesktopUnixServices::setApplicationBadge(qint64 number)
{
#if QT_CONFIG(dbus)
    if (qGuiApp->desktopFileName().isEmpty()) {
        qCWarning(lcQpaServices, "Cannot set badge number - QGuiApplication::desktopFileName() is empty");
        return;
    }


    const QString launcherUrl = QStringLiteral("application://") + qGuiApp->desktopFileName() + QStringLiteral(".desktop");
    const qint64 count = qBound(0, number, 9999);
    QVariantMap dbusUnityProperties;

    if (count > 0) {
        dbusUnityProperties[QStringLiteral("count")] = count;
        dbusUnityProperties[QStringLiteral("count-visible")] = true;
    } else {
        dbusUnityProperties[QStringLiteral("count-visible")] = false;
    }

    auto signal = QDBusMessage::createSignal(QStringLiteral("/com/canonical/unity/launcherentry/")
        + qGuiApp->applicationName(), QStringLiteral("com.canonical.Unity.LauncherEntry"), QStringLiteral("Update"));

    signal.setArguments({launcherUrl, dbusUnityProperties});

    QDBusConnection::sessionBus().send(signal);
#else
    Q_UNUSED(number)
#endif
}